

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdrawhelper.cpp
# Opt level: O0

void __thiscall VSpanData::setupMatrix(VSpanData *this,VMatrix *matrix)

{
  bool bVar1;
  bool bVar2;
  bool *in_RDI;
  float fVar3;
  float fVar4;
  VMatrix *unaff_retaddr;
  float f2;
  float f1;
  bool affine;
  VMatrix inv;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  
  VMatrix::inverted(unaff_retaddr,in_RDI);
  *(undefined4 *)(in_RDI + 200) = local_38;
  *(undefined4 *)(in_RDI + 0xcc) = local_34;
  *(undefined4 *)(in_RDI + 0xd0) = local_30;
  *(undefined4 *)(in_RDI + 0xd4) = local_2c;
  *(undefined4 *)(in_RDI + 0xd8) = local_28;
  *(undefined4 *)(in_RDI + 0xdc) = local_24;
  *(undefined4 *)(in_RDI + 0xe0) = local_18;
  *(undefined4 *)(in_RDI + 0xe4) = local_20;
  *(undefined4 *)(in_RDI + 0xe8) = local_1c;
  bVar1 = (bool)VMatrix::type((VMatrix *)
                              CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  in_RDI[0xed] = bVar1;
  bVar2 = VMatrix::isAffine((VMatrix *)0x11a59f);
  fVar3 = *(float *)(in_RDI + 200) * *(float *)(in_RDI + 200) +
          *(float *)(in_RDI + 0xd4) * *(float *)(in_RDI + 0xd4);
  fVar4 = *(float *)(in_RDI + 0xcc) * *(float *)(in_RDI + 0xcc) +
          *(float *)(in_RDI + 0xd8) * *(float *)(in_RDI + 0xd8);
  bVar1 = false;
  if ((((bVar2) && (bVar1 = false, fVar3 < 10000.0)) && (bVar1 = false, fVar4 < 10000.0)) &&
     (((bVar1 = false, 1.5258789e-05 < fVar3 && (bVar1 = false, 1.5258789e-05 < fVar4)) &&
      (bVar1 = false, ABS(*(float *)(in_RDI + 0xe4)) < 10000.0)))) {
    bVar1 = ABS(*(float *)(in_RDI + 0xe8)) < 10000.0;
  }
  in_RDI[0xec] = bVar1;
  return;
}

Assistant:

void VSpanData::setupMatrix(const VMatrix &matrix)
{
    VMatrix inv = matrix.inverted();
    m11 = inv.m11;
    m12 = inv.m12;
    m13 = inv.m13;
    m21 = inv.m21;
    m22 = inv.m22;
    m23 = inv.m23;
    m33 = inv.m33;
    dx = inv.mtx;
    dy = inv.mty;
    transformType = inv.type();

    const bool  affine = inv.isAffine();
    const float f1 = m11 * m11 + m21 * m21;
    const float f2 = m12 * m12 + m22 * m22;
    fast_matrix = affine && f1 < 1e4 && f2 < 1e4 && f1 > (1.0 / 65536) &&
                  f2 > (1.0 / 65536) && fabs(dx) < 1e4 && fabs(dy) < 1e4;
}